

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O0

bool __thiscall ThreadRegion::removeSuccessor(ThreadRegion *this,ThreadRegion *successor)

{
  size_type sVar1;
  long in_RSI;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_> *in_RDI;
  set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>
  *in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::erase
              (in_stack_ffffffffffffffe0,(key_type *)in_RDI);
    sVar1 = std::set<ThreadRegion_*,_std::less<ThreadRegion_*>,_std::allocator<ThreadRegion_*>_>::
            erase(in_RDI,(key_type *)in_RDI);
    local_1 = sVar1 != 0;
  }
  return local_1;
}

Assistant:

bool ThreadRegion::removeSuccessor(ThreadRegion *successor) {
    if (!successor) {
        return false;
    }
    successors_.erase(successor);
    return successor->predecessors_.erase(this);
}